

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::Next(Parser *this)

{
  int *piVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  Parser *pPVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  long *plVar8;
  uint uVar9;
  ulong *puVar10;
  char *pcVar11;
  byte *pbVar12;
  size_type *psVar13;
  byte *pbVar14;
  byte bVar15;
  int iVar16;
  string *in_RSI;
  undefined8 uVar17;
  char cVar18;
  _Alloc_hider _Var19;
  byte bVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  string ch;
  uint64_t val_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Parser *local_a0;
  byte local_91;
  size_type *local_90;
  int local_88;
  int local_84;
  uint local_80;
  uint local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  string local_50;
  
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &in_RSI[2]._M_string_length;
  local_a0 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_58,(pointer)in_RSI[2]._M_string_length);
  pcVar2 = (pointer)in_RSI->_M_string_length;
  puVar3 = (undefined1 *)in_RSI[1]._M_string_length;
  (in_RSI->_M_dataplus)._M_p = pcVar2;
  local_91 = pcVar2 == (pointer)in_RSI[0x39]._M_string_length;
  local_90 = &in_RSI[1]._M_string_length;
  in_RSI[1].field_2._M_allocated_capacity = 0;
  *puVar3 = 0;
  *(undefined1 *)&in_RSI[1]._M_dataplus._M_p = 1;
  do {
    pbVar14 = (byte *)in_RSI->_M_string_length;
    pbVar7 = pbVar14 + 1;
    in_RSI->_M_string_length = (size_type)pbVar7;
    bVar20 = *pbVar14;
    uVar22 = (uint)(char)bVar20;
    *(uint *)((long)&in_RSI->field_2 + 0xc) = uVar22;
    bVar24 = true;
    uVar9 = (uint)bVar20;
    if (bVar20 < 0x20) {
      if (bVar20 < 10) {
        if (uVar9 == 0) {
          in_RSI->_M_string_length = (size_type)pbVar14;
          *(undefined4 *)((long)&in_RSI->field_2 + 0xc) = 0x100;
          goto switchD_00105737_caseD_28;
        }
        if (uVar9 != 9) goto switchD_00105737_caseD_21;
      }
      else if (bVar20 == 10) {
        *(byte **)&in_RSI->field_2 = pbVar7;
        piVar1 = (int *)((long)&in_RSI->field_2 + 8);
        *piVar1 = *piVar1 + 1;
        bVar24 = true;
        local_91 = 1;
      }
      else if (bVar20 != 0xd) goto switchD_00105737_caseD_21;
      goto switchD_00105737_caseD_20;
    }
    switch(bVar20) {
    case 0x20:
      goto switchD_00105737_caseD_20;
    case 0x21:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x2a:
    case 0x2b:
    case 0x2d:
    case 0x2e:
switchD_00105737_caseD_21:
      if ((bVar20 == 0x5f) || ((uVar22 & 0xffffffdf) - 0x41 < 0x1a)) {
        pcVar11 = (char *)in_RSI->_M_string_length;
        cVar18 = *pcVar11;
        if (((int)cVar18 - 0x30U < 10 || cVar18 == '_') || ((int)cVar18 & 0xffffffdfU) - 0x41 < 0x1a
           ) {
          do {
            pcVar11 = pcVar11 + 1;
            in_RSI->_M_string_length = (size_type)pcVar11;
            cVar18 = *pcVar11;
          } while (((int)cVar18 - 0x30U < 10 || cVar18 == '_') ||
                   ((int)cVar18 & 0xffffffdfU) - 0x41 < 0x1a);
        }
        std::__cxx11::string::replace
                  ((ulong)local_90,in_RSI[1].field_2._M_allocated_capacity,(char *)0x0,
                   (ulong)pbVar14);
        *(undefined4 *)((long)&in_RSI->field_2 + 0xc) = 0x104;
LAB_0010598b:
        bVar24 = false;
        *(undefined2 *)&(local_a0->super_ParserState).prev_cursor_ = 0;
        goto switchD_00105737_caseD_20;
      }
      if ((uVar9 == 0x2d) || (uVar9 == 0x2b)) {
        iVar5 = strncmp((char *)pbVar7,"inf",3);
        if ((iVar5 == 0) &&
           (bVar15 = pbVar14[4],
           (9 < (int)(char)bVar15 - 0x30U && bVar15 != 0x5f) &&
           0x19 < ((int)(char)bVar15 & 0xffffffdfU) - 0x41)) {
          std::__cxx11::string::replace
                    ((ulong)local_90,0,(char *)in_RSI[1].field_2._M_allocated_capacity,
                     (ulong)pbVar14);
          *(undefined4 *)((long)&in_RSI->field_2 + 0xc) = 0x103;
          in_RSI->_M_string_length = in_RSI->_M_string_length + 3;
          goto LAB_0010598b;
        }
        if (((int)(char)*pbVar7 == 0x5f) || (((int)(char)*pbVar7 & 0xffffffdfU) - 0x41 < 0x1a))
        break;
      }
      if ((bVar20 == 0x2e) && (9 < (int)(char)*pbVar7 - 0x30U)) break;
      pbVar6 = pbVar14;
      if ((uVar22 - 0x30 < 10) ||
         ((uVar9 < 0x2f && (pbVar6 = pbVar7, (0x680000000000U >> ((ulong)uVar9 & 0x3f) & 1) != 0))))
      {
        bVar15 = bVar20;
        if ((9 < uVar22 - 0x30) && ((int)(char)*pbVar7 - 0x30U < 10)) {
          in_RSI->_M_string_length = (size_type)(pbVar14 + 2);
          pbVar6 = pbVar7;
          bVar15 = pbVar14[1];
        }
        bVar24 = false;
        if ((bVar20 != 0x2e) && (bVar15 == 0x30)) {
          bVar24 = (*(byte *)in_RSI->_M_string_length & 0xdf) == 0x58;
        }
        if (bVar24) {
          pbVar6 = (byte *)(in_RSI->_M_string_length + 1);
          in_RSI->_M_string_length = (size_type)pbVar6;
        }
        uVar9 = (uint)(bVar20 != 0x2e);
        pcVar11 = (char *)in_RSI->_M_string_length;
        do {
          uVar22 = (int)*pcVar11 - 0x30;
          if (bVar24) {
            if ((uVar22 < 10) || (((int)*pcVar11 & 0xffffffdfU) - 0x41 < 6)) {
              pcVar11 = pcVar11 + 1;
              do {
                do {
                  in_RSI->_M_string_length = (size_type)pcVar11;
                  cVar18 = *pcVar11;
                  pcVar11 = pcVar11 + 1;
                } while ((int)cVar18 - 0x30U < 10);
              } while (((int)cVar18 & 0xffffffdfU) - 0x41 < 6);
LAB_00106224:
              pcVar11 = pcVar11 + -1;
            }
          }
          else if (uVar22 < 10) {
            pcVar11 = pcVar11 + 1;
            do {
              in_RSI->_M_string_length = (size_type)pcVar11;
              cVar18 = *pcVar11;
              pcVar11 = pcVar11 + 1;
            } while ((int)cVar18 - 0x30U < 10);
            goto LAB_00106224;
          }
          if (*pcVar11 != '.') goto LAB_00106244;
          pcVar11 = pcVar11 + 1;
          in_RSI->_M_string_length = (size_type)pcVar11;
          bVar25 = uVar9 != 0;
          uVar9 = 0;
        } while (bVar25);
        uVar9 = 0xffffffff;
LAB_00106244:
        if ((int)uVar9 < 0) {
          uVar9 = 0xffffffff;
        }
        else {
          pbVar7 = (byte *)in_RSI->_M_string_length;
          if (pbVar6 < pbVar7) {
            pbVar12 = pbVar6;
            if (uVar9 == 0) {
              pbVar12 = pbVar7;
            }
            if (((bVar24) && (pbVar6 = pbVar12, (*pbVar7 & 0xdf) == 0x50)) ||
               ((*pbVar7 & 0xdf) == 0x45)) {
              in_RSI->_M_string_length = (size_type)(pbVar7 + 1);
              if ((pbVar7[1] == 0x2d) || (pbVar7[1] == 0x2b)) {
                in_RSI->_M_string_length = (size_type)(pbVar7 + 2);
              }
              pbVar6 = (byte *)in_RSI->_M_string_length;
              bVar20 = *pbVar6;
              pbVar7 = pbVar6;
              while ((int)(char)bVar20 - 0x30U < 10) {
                pbVar7 = pbVar7 + 1;
                in_RSI->_M_string_length = (size_type)pbVar7;
                bVar20 = *pbVar7;
              }
              uVar9 = 0;
              if (bVar20 == 0x2e) {
                in_RSI->_M_string_length = (size_type)(pbVar7 + 1);
                uVar9 = 0xffffffff;
              }
            }
          }
        }
        if ((-1 < (int)uVar9) && (pbVar6 < (byte *)in_RSI->_M_string_length)) {
          std::__cxx11::string::replace
                    ((ulong)local_90,in_RSI[1].field_2._M_allocated_capacity,(char *)0x0,
                     (ulong)pbVar14);
          *(uint *)((long)&in_RSI->field_2 + 0xc) = (uVar9 == 0) + 0x102;
          goto LAB_0010598b;
        }
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pbVar14,in_RSI->_M_string_length);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x1527c4);
        puVar10 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_c0.field_2._M_allocated_capacity = *puVar10;
          local_c0.field_2._8_8_ = plVar8[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *puVar10;
          local_c0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_c0._M_string_length = plVar8[1];
        *plVar8 = (long)puVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        Error(local_a0,in_RSI);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        uVar17 = local_78.field_2._M_allocated_capacity;
        _Var19._M_p = local_78._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) goto LAB_00106568;
      }
      else {
        local_c0._M_string_length = 0;
        local_c0.field_2._M_allocated_capacity =
             local_c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_replace_aux((ulong)&local_c0,0,0,'\x01');
        paVar21 = &local_78.field_2;
        if (0x5e < uVar22 - 0x20) {
          NumToString<int>(&local_50,uVar22);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1527d5);
          puVar10 = (ulong *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_78.field_2._M_allocated_capacity = *puVar10;
            local_78.field_2._8_8_ = plVar8[3];
            local_78._M_dataplus._M_p = (pointer)paVar21;
          }
          else {
            local_78.field_2._M_allocated_capacity = *puVar10;
            local_78._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_78._M_string_length = plVar8[1];
          *plVar8 = (long)puVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar21) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        std::operator+(&local_78,"illegal character: ",&local_c0);
        Error(local_a0,in_RSI);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar21) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        uVar17 = local_c0.field_2._M_allocated_capacity;
        _Var19._M_p = local_c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
LAB_00106568:
          operator_delete(_Var19._M_p,uVar17 + 1);
        }
      }
      goto LAB_0010576a;
    case 0x22:
    case 0x27:
      pbVar7 = (byte *)in_RSI->_M_string_length;
      bVar15 = *pbVar7;
      bVar24 = true;
      if (bVar15 != bVar20) {
        uVar23 = 0xffffffff;
        psVar13 = local_90;
        do {
          pPVar4 = local_a0;
          paVar21 = &local_c0.field_2;
          if (bVar15 < 0x20) {
            local_c0._M_dataplus._M_p = (pointer)paVar21;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,"illegal character in string constant","");
            Error(local_a0,in_RSI);
            goto LAB_00106555;
          }
          uVar9 = (uint)uVar23;
          cVar18 = (char)psVar13;
          if (bVar15 != 0x5c) {
            if (uVar9 == 0xffffffff) {
              *(byte *)&in_RSI[1]._M_dataplus._M_p =
                   *(byte *)&in_RSI[1]._M_dataplus._M_p & (int)(char)bVar15 - 0x20U < 0x5f;
              in_RSI->_M_string_length = (size_type)(pbVar7 + 1);
              std::__cxx11::string::push_back(cVar18);
              uVar23 = 0xffffffff;
              goto LAB_00105b75;
            }
            local_c0._M_dataplus._M_p = (pointer)paVar21;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,"illegal Unicode sequence (unpaired high surrogate)","");
            Error(local_a0,in_RSI);
            goto LAB_00106555;
          }
          *(undefined1 *)&in_RSI[1]._M_dataplus._M_p = 0;
          pbVar14 = pbVar7 + 1;
          in_RSI->_M_string_length = (size_type)pbVar14;
          if ((uVar9 != 0xffffffff) && (*pbVar14 != 0x75)) {
            local_c0._M_dataplus._M_p = (pointer)paVar21;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,"illegal Unicode sequence (unpaired high surrogate)","");
            Error(local_a0,in_RSI);
            goto LAB_00106555;
          }
          bVar15 = *pbVar14;
          if (bVar15 < 0x62) {
            if (bVar15 < 0x2f) {
              if ((bVar15 == 0x22) || (bVar15 == 0x27)) {
LAB_00105b69:
                std::__cxx11::string::push_back(cVar18);
                in_RSI->_M_string_length = in_RSI->_M_string_length + 1;
                goto LAB_00105b75;
              }
            }
            else if ((bVar15 == 0x2f) || (bVar15 == 0x5c)) goto LAB_00105b69;
            goto switchD_00105a00_caseD_6f;
          }
          switch(bVar15) {
          case 0x6e:
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
          case 0x76:
          case 0x77:
            goto switchD_00105a00_caseD_6f;
          case 0x72:
            break;
          case 0x74:
            break;
          case 0x75:
            in_RSI->_M_string_length = (size_type)(pbVar7 + 2);
            ParseHexNum(local_a0,(int)in_RSI,(uint64_t *)0x4);
            *(undefined1 *)((long)&(pPVar4->super_ParserState).prev_cursor_ + 1) = 1;
            psVar13 = local_90;
            if (*(char *)&(pPVar4->super_ParserState).prev_cursor_ == '\0') {
              uVar22 = (uint)local_78._M_dataplus._M_p;
              if (((ulong)local_78._M_dataplus._M_p & 0xfffffffffffffc00) == 0xdc00) {
                if (uVar9 == 0xffffffff) {
                  local_c0._M_dataplus._M_p = (pointer)paVar21;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_c0,"illegal Unicode sequence (unpaired low surrogate)"
                             ,"");
                  Error(local_a0,in_RSI);
                  psVar13 = local_90;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c0._M_dataplus._M_p != paVar21) {
                    operator_delete(local_c0._M_dataplus._M_p,
                                    local_c0.field_2._M_allocated_capacity + 1);
                  }
                  uVar23 = 0xffffffff;
LAB_00105da7:
                  bVar24 = false;
                }
                else {
                  uVar22 = (uVar22 & 0x3ff) + (uVar9 & 0x3ff) * 0x400 + 0x10000;
                  uVar23 = 0;
                  iVar5 = 1;
                  iVar16 = -6;
                  uVar9 = 0;
                  do {
                    bVar15 = (char)uVar9 * '\x05' + '\x06' + (uVar9 == 0) & 0x1f;
                    if (uVar22 >> bVar15 == 0) {
                      local_7c = (uint)uVar23;
                      cVar18 = (char)local_90;
                      local_88 = iVar16;
                      local_84 = iVar5;
                      local_80 = uVar22 >> bVar15;
                      std::__cxx11::string::push_back(cVar18);
                      iVar5 = local_84;
                      if (uVar9 != 0) {
                        do {
                          std::__cxx11::string::push_back(cVar18);
                          iVar5 = iVar5 + -1;
                        } while (1 < iVar5);
                      }
                      uVar23 = (ulong)local_7c;
                      iVar5 = local_84;
                      iVar16 = local_88;
                      if (local_80 == 0) break;
                    }
                    bVar24 = 4 < uVar9;
                    uVar9 = uVar9 + 1;
                    uVar23 = CONCAT71((int7)(uVar23 >> 8),bVar24);
                    iVar5 = iVar5 + 1;
                    iVar16 = iVar16 + 6;
                  } while (uVar9 != 6);
                  if ((uVar23 & 1) != 0) {
LAB_00106640:
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                                  ,0x206,"int flatbuffers::ToUTF8(uint32_t, std::string *)");
                  }
                  bVar24 = true;
                  uVar23 = 0xffffffff;
                  psVar13 = local_90;
                }
              }
              else if (((ulong)local_78._M_dataplus._M_p & 0xfffffffffffffc00) == 0xd800) {
                if (uVar9 != 0xffffffff) {
                  local_c0._M_dataplus._M_p = (pointer)paVar21;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_c0,
                             "illegal Unicode sequence (multiple high surrogates)","");
                  Error(local_a0,in_RSI);
LAB_00105d32:
                  psVar13 = local_90;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c0._M_dataplus._M_p != paVar21) {
                    operator_delete(local_c0._M_dataplus._M_p,
                                    local_c0.field_2._M_allocated_capacity + 1);
                  }
                  goto LAB_00105da7;
                }
                bVar24 = true;
                uVar23 = (ulong)local_78._M_dataplus._M_p & 0xffffffff;
              }
              else {
                if (uVar9 != 0xffffffff) {
                  local_c0._M_dataplus._M_p = (pointer)paVar21;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_c0,
                             "illegal Unicode sequence (unpaired high surrogate)","");
                  Error(local_a0,in_RSI);
                  goto LAB_00105d32;
                }
                if ((int)uVar22 < 0) {
                  __assert_fail("!(ucc & 0x80000000)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                                ,500,"int flatbuffers::ToUTF8(uint32_t, std::string *)");
                }
                uVar23 = 0;
                iVar5 = 1;
                iVar16 = -6;
                uVar9 = 0;
                do {
                  bVar15 = (char)uVar9 * '\x05' + '\x06' + (uVar9 == 0) & 0x1f;
                  if (uVar22 >> bVar15 == 0) {
                    local_7c = (uint)uVar23;
                    cVar18 = (char)local_90;
                    local_88 = iVar16;
                    local_84 = iVar5;
                    local_80 = uVar22 >> bVar15;
                    std::__cxx11::string::push_back(cVar18);
                    iVar5 = local_84;
                    if (uVar9 != 0) {
                      do {
                        std::__cxx11::string::push_back(cVar18);
                        iVar5 = iVar5 + -1;
                      } while (1 < iVar5);
                    }
                    uVar23 = (ulong)local_7c;
                    iVar5 = local_84;
                    iVar16 = local_88;
                    if (local_80 == 0) break;
                  }
                  bVar24 = 4 < uVar9;
                  uVar9 = uVar9 + 1;
                  uVar23 = CONCAT71((int7)(uVar23 >> 8),bVar24);
                  iVar5 = iVar5 + 1;
                  iVar16 = iVar16 + 6;
                } while (uVar9 != 6);
                if ((uVar23 & 1) != 0) goto LAB_00106640;
                bVar24 = true;
                uVar23 = 0xffffffff;
                psVar13 = local_90;
              }
            }
            else {
              bVar24 = false;
            }
            if (bVar24) goto LAB_00105b75;
            goto LAB_0010576a;
          case 0x78:
            in_RSI->_M_string_length = (size_type)(pbVar7 + 2);
            ParseHexNum(local_a0,(int)in_RSI,(uint64_t *)0x2);
            psVar13 = local_90;
            *(undefined1 *)((long)&(pPVar4->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(pPVar4->super_ParserState).prev_cursor_ == '\0') {
              std::__cxx11::string::push_back((char)local_90);
              goto LAB_00105b75;
            }
            goto LAB_0010576a;
          default:
            if ((bVar15 == 0x62) || (bVar15 == 0x66)) goto LAB_00105b69;
switchD_00105a00_caseD_6f:
            local_c0._M_dataplus._M_p = (pointer)paVar21;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,"unknown escape code in string constant","");
            Error(local_a0,in_RSI);
            goto LAB_00106555;
          }
          std::__cxx11::string::push_back(cVar18);
          in_RSI->_M_string_length = in_RSI->_M_string_length + 1;
LAB_00105b75:
          pbVar7 = (byte *)in_RSI->_M_string_length;
          bVar15 = *pbVar7;
        } while (bVar15 != bVar20);
        bVar24 = (int)uVar23 == -1;
      }
      if (!bVar24) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"illegal Unicode sequence (unpaired high surrogate)","");
        Error(local_a0,in_RSI);
LAB_00106555:
        uVar17 = local_c0.field_2._M_allocated_capacity;
        _Var19._M_p = local_c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_00106568;
        goto LAB_0010576a;
      }
      in_RSI->_M_string_length = (size_type)(pbVar7 + 1);
      if ((*(char *)&in_RSI[1]._M_dataplus._M_p == '\0') &&
         (in_RSI[0x25].field_2._M_local_buf[9] == '\0')) {
        pbVar14 = (byte *)in_RSI[1]._M_string_length + in_RSI[1].field_2._M_allocated_capacity;
        pbVar7 = (byte *)in_RSI[1]._M_string_length;
        do {
          pbVar6 = pbVar7;
          if (pbVar14 <= pbVar6) goto LAB_00105f8a;
          bVar20 = *pbVar6;
          uVar9 = 0;
          uVar22 = 0x80;
          do {
            if ((uVar22 & bVar20) == 0) goto LAB_001060b6;
            uVar9 = uVar9 + 1;
            uVar22 = uVar22 >> 1;
          } while (uVar9 != 6);
          uVar9 = 6;
LAB_001060b6:
          bVar15 = 0xff;
          pbVar7 = pbVar6;
          if (-1 < (char)(bVar20 << ((byte)uVar9 & 0x1f))) {
            if (uVar9 == 0) {
              pbVar7 = pbVar6 + 1;
              bVar15 = bVar20;
            }
            else if (uVar9 < 5 && uVar9 != 1) {
              bVar20 = -(pbVar6[1] & 0xc0);
              pbVar7 = pbVar6 + 1;
              bVar15 = 0xff;
            }
          }
        } while (-1 < (char)bVar15);
        if (pbVar6 < pbVar14) {
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"illegal UTF-8 sequence","",pbVar7,bVar20);
          Error(local_a0,in_RSI);
          goto LAB_00106555;
        }
      }
LAB_00105f8a:
      *(undefined4 *)((long)&in_RSI->field_2 + 0xc) = 0x101;
      break;
    case 0x28:
    case 0x29:
    case 0x2c:
      break;
    case 0x2f:
      if (*pbVar7 != 0x2f) {
        if (*pbVar7 == 0x2a) {
          iVar5 = *(int *)((long)&in_RSI->field_2 + 8);
          pbVar14 = pbVar14 + 2;
          do {
            in_RSI->_M_string_length = (size_type)pbVar14;
            if (*pbVar14 == 10) {
              *(byte **)&in_RSI->field_2 = pbVar14;
              iVar5 = iVar5 + 1;
              *(int *)((long)&in_RSI->field_2 + 8) = iVar5;
            }
            else if ((*pbVar14 == 0x2a) && (pbVar14[1] == 0x2f)) {
              in_RSI->_M_string_length = (size_type)(pbVar14 + 2);
              goto switchD_00105737_caseD_20;
            }
            bVar20 = *pbVar14;
            pbVar14 = pbVar14 + 1;
          } while (bVar20 != 0);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"end of file in comment","");
          Error(local_a0,in_RSI);
LAB_001064e0:
          uVar17 = local_c0.field_2._M_allocated_capacity;
          _Var19._M_p = local_c0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_00106568;
          goto LAB_0010576a;
        }
        goto switchD_00105737_caseD_21;
      }
      paVar21 = &local_c0.field_2;
      pbVar7 = pbVar14 + 2;
      while( true ) {
        in_RSI->_M_string_length = (size_type)pbVar7;
        if ((*pbVar7 < 0xe) && ((0x2401U >> (*pbVar7 & 0x1f) & 1) != 0)) break;
        pbVar7 = pbVar7 + 1;
      }
      if (pbVar14[2] == 0x2f) {
        local_c0._M_dataplus._M_p = (pointer)paVar21;
        if ((local_91 & 1) == 0) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"a documentation comment should be on a line on its own",""
                    );
          Error(local_a0,in_RSI);
          goto LAB_001064e0;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,pbVar14 + 3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_58,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar21) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
      }
      goto switchD_00105737_caseD_20;
    default:
      if ((4 < bVar20 - 0x3a) &&
         ((0x22 < bVar20 - 0x5b || ((0x500000005U >> ((ulong)(bVar20 - 0x5b) & 0x3f) & 1) == 0))))
      goto switchD_00105737_caseD_21;
    }
switchD_00105737_caseD_28:
    *(undefined2 *)&(local_a0->super_ParserState).prev_cursor_ = 0;
LAB_0010576a:
    bVar24 = false;
switchD_00105737_caseD_20:
    if (!bVar24) {
      return SUB82(local_a0,0);
    }
  } while( true );
}

Assistant:

CheckedError Parser::Next() {
  doc_comment_.clear();
  prev_cursor_ = cursor_;
  bool seen_newline = cursor_ == source_;
  attribute_.clear();
  attr_is_trivial_ascii_string_ = true;
  for (;;) {
    char c = *cursor_++;
    token_ = c;
    switch (c) {
      case '\0':
        cursor_--;
        token_ = kTokenEof;
        return NoError();
      case ' ':
      case '\r':
      case '\t': break;
      case '\n':
        MarkNewLine();
        seen_newline = true;
        break;
      case '{':
      case '}':
      case '(':
      case ')':
      case '[':
      case ']':
      case '<':
      case '>':
      case ',':
      case ':':
      case ';':
      case '=': return NoError();
      case '\"':
      case '\'': {
        int unicode_high_surrogate = -1;

        while (*cursor_ != c) {
          if (*cursor_ < ' ' && static_cast<signed char>(*cursor_) >= 0)
            return Error("illegal character in string constant");
          if (*cursor_ == '\\') {
            attr_is_trivial_ascii_string_ = false;  // has escape sequence
            cursor_++;
            if (unicode_high_surrogate != -1 && *cursor_ != 'u') {
              return Error(
                  "illegal Unicode sequence (unpaired high surrogate)");
            }
            switch (*cursor_) {
              case 'n':
                attribute_ += '\n';
                cursor_++;
                break;
              case 't':
                attribute_ += '\t';
                cursor_++;
                break;
              case 'r':
                attribute_ += '\r';
                cursor_++;
                break;
              case 'b':
                attribute_ += '\b';
                cursor_++;
                break;
              case 'f':
                attribute_ += '\f';
                cursor_++;
                break;
              case '\"':
                attribute_ += '\"';
                cursor_++;
                break;
              case '\'':
                attribute_ += '\'';
                cursor_++;
                break;
              case '\\':
                attribute_ += '\\';
                cursor_++;
                break;
              case '/':
                attribute_ += '/';
                cursor_++;
                break;
              case 'x': {  // Not in the JSON standard
                cursor_++;
                uint64_t val;
                ECHECK(ParseHexNum(2, &val));
                attribute_ += static_cast<char>(val);
                break;
              }
              case 'u': {
                cursor_++;
                uint64_t val;
                ECHECK(ParseHexNum(4, &val));
                if (val >= 0xD800 && val <= 0xDBFF) {
                  if (unicode_high_surrogate != -1) {
                    return Error(
                        "illegal Unicode sequence (multiple high surrogates)");
                  } else {
                    unicode_high_surrogate = static_cast<int>(val);
                  }
                } else if (val >= 0xDC00 && val <= 0xDFFF) {
                  if (unicode_high_surrogate == -1) {
                    return Error(
                        "illegal Unicode sequence (unpaired low surrogate)");
                  } else {
                    int code_point = 0x10000 +
                                     ((unicode_high_surrogate & 0x03FF) << 10) +
                                     (val & 0x03FF);
                    ToUTF8(code_point, &attribute_);
                    unicode_high_surrogate = -1;
                  }
                } else {
                  if (unicode_high_surrogate != -1) {
                    return Error(
                        "illegal Unicode sequence (unpaired high surrogate)");
                  }
                  ToUTF8(static_cast<int>(val), &attribute_);
                }
                break;
              }
              default: return Error("unknown escape code in string constant");
            }
          } else {  // printable chars + UTF-8 bytes
            if (unicode_high_surrogate != -1) {
              return Error(
                  "illegal Unicode sequence (unpaired high surrogate)");
            }
            // reset if non-printable
            attr_is_trivial_ascii_string_ &=
                check_ascii_range(*cursor_, ' ', '~');

            attribute_ += *cursor_++;
          }
        }
        if (unicode_high_surrogate != -1) {
          return Error("illegal Unicode sequence (unpaired high surrogate)");
        }
        cursor_++;
        if (!attr_is_trivial_ascii_string_ && !opts.allow_non_utf8 &&
            !ValidateUTF8(attribute_)) {
          return Error("illegal UTF-8 sequence");
        }
        token_ = kTokenStringConstant;
        return NoError();
      }
      case '/':
        if (*cursor_ == '/') {
          const char *start = ++cursor_;
          while (*cursor_ && *cursor_ != '\n' && *cursor_ != '\r') cursor_++;
          if (*start == '/') {  // documentation comment
            if (!seen_newline)
              return Error(
                  "a documentation comment should be on a line on its own");
            doc_comment_.push_back(std::string(start + 1, cursor_));
          }
          break;
        } else if (*cursor_ == '*') {
          cursor_++;
          // TODO: make nested.
          while (*cursor_ != '*' || cursor_[1] != '/') {
            if (*cursor_ == '\n') MarkNewLine();
            if (!*cursor_) return Error("end of file in comment");
            cursor_++;
          }
          cursor_ += 2;
          break;
        }
        FLATBUFFERS_FALLTHROUGH();  // else fall thru
      default:
        if (IsIdentifierStart(c)) {
          // Collect all chars of an identifier:
          const char *start = cursor_ - 1;
          while (IsIdentifierStart(*cursor_) || is_digit(*cursor_)) cursor_++;
          attribute_.append(start, cursor_);
          token_ = kTokenIdentifier;
          return NoError();
        }

        const auto has_sign = (c == '+') || (c == '-');
        if (has_sign) {
          // Check for +/-inf which is considered a float constant.
          if (strncmp(cursor_, "inf", 3) == 0 &&
              !(IsIdentifierStart(cursor_[3]) || is_digit(cursor_[3]))) {
            attribute_.assign(cursor_ - 1, cursor_ + 3);
            token_ = kTokenFloatConstant;
            cursor_ += 3;
            return NoError();
          }

          if (IsIdentifierStart(*cursor_)) {
            // '-'/'+' and following identifier - it could be a predefined
            // constant. Return the sign in token_, see ParseSingleValue.
            return NoError();
          }
        }

        auto dot_lvl =
            (c == '.') ? 0 : 1;  // dot_lvl==0 <=> exactly one '.' seen
        if (!dot_lvl && !is_digit(*cursor_)) return NoError();  // enum?
        // Parser accepts hexadecimal-floating-literal (see C++ 5.13.4).
        if (is_digit(c) || has_sign || !dot_lvl) {
          const auto start = cursor_ - 1;
          auto start_digits = !is_digit(c) ? cursor_ : cursor_ - 1;
          if (!is_digit(c) && is_digit(*cursor_)) {
            start_digits = cursor_;  // see digit in cursor_ position
            c = *cursor_++;
          }
          // hex-float can't begind with '.'
          auto use_hex = dot_lvl && (c == '0') && is_alpha_char(*cursor_, 'X');
          if (use_hex) start_digits = ++cursor_;  // '0x' is the prefix, skip it
          // Read an integer number or mantisa of float-point number.
          do {
            if (use_hex) {
              while (is_xdigit(*cursor_)) cursor_++;
            } else {
              while (is_digit(*cursor_)) cursor_++;
            }
          } while ((*cursor_ == '.') && (++cursor_) && (--dot_lvl >= 0));
          // Exponent of float-point number.
          if ((dot_lvl >= 0) && (cursor_ > start_digits)) {
            // The exponent suffix of hexadecimal float number is mandatory.
            if (use_hex && !dot_lvl) start_digits = cursor_;
            if ((use_hex && is_alpha_char(*cursor_, 'P')) ||
                is_alpha_char(*cursor_, 'E')) {
              dot_lvl = 0;  // Emulate dot to signal about float-point number.
              cursor_++;
              if (*cursor_ == '+' || *cursor_ == '-') cursor_++;
              start_digits = cursor_;  // the exponent-part has to have digits
              // Exponent is decimal integer number
              while (is_digit(*cursor_)) cursor_++;
              if (*cursor_ == '.') {
                cursor_++;  // If see a dot treat it as part of invalid number.
                dot_lvl = -1;  // Fall thru to Error().
              }
            }
          }
          // Finalize.
          if ((dot_lvl >= 0) && (cursor_ > start_digits)) {
            attribute_.append(start, cursor_);
            token_ = dot_lvl ? kTokenIntegerConstant : kTokenFloatConstant;
            return NoError();
          } else {
            return Error("invalid number: " + std::string(start, cursor_));
          }
        }
        std::string ch;
        ch = c;
        if (false == check_ascii_range(c, ' ', '~'))
          ch = "code: " + NumToString(c);
        return Error("illegal character: " + ch);
    }
  }
}